

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFNMatrix<9,_TFad<6,_double>_>::TPZFNMatrix
          (TPZFNMatrix<9,_TFad<6,_double>_> *this,int64_t row,int64_t col,TFad<6,_double> *val)

{
  undefined8 *puVar1;
  long lVar2;
  TFad<6,_double> TStack_68;
  
  (this->super_TPZFMatrix<TFad<6,_double>_>).super_TPZMatrix<TFad<6,_double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_016ad398;
  TPZFMatrix<TFad<6,_double>_>::TPZFMatrix
            (&this->super_TPZFMatrix<TFad<6,_double>_>,&PTR_PTR_016ad650,row,col,this->fBuf,9);
  (this->super_TPZFMatrix<TFad<6,_double>_>).super_TPZMatrix<TFad<6,_double>_>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_016ad398;
  lVar2 = 0x98;
  do {
    *(undefined ***)
     ((long)(this->super_TPZFMatrix<TFad<6,_double>_>).fPivot.fExtAlloc + lVar2 + -0x60) =
         &PTR__TFad_0166af08;
    puVar1 = (undefined8 *)
             ((long)(&((TPZFMatrix<TFad<6,_double>_> *)
                      (&((TPZFMatrix<TFad<6,_double>_> *)
                        (&(this->super_TPZFMatrix<TFad<6,_double>_>).fPivot + -1))->fPivot + -1))->
                      fPivot + 0xffffffffffffffff) + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)
     ((long)(this->super_TPZFMatrix<TFad<6,_double>_>).fPivot.fExtAlloc + lVar2 + -0x28) = 0;
    puVar1 = (undefined8 *)
             ((long)(this->super_TPZFMatrix<TFad<6,_double>_>).fPivot.fExtAlloc + lVar2 + -0x48);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)
             ((long)(this->super_TPZFMatrix<TFad<6,_double>_>).fPivot.fExtAlloc + lVar2 + -0x38);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0x318);
  TFad<6,_double>::TFad(&TStack_68,val);
  TPZFMatrix<TFad<6,_double>_>::operator=(&this->super_TPZFMatrix<TFad<6,_double>_>,&TStack_68);
  return;
}

Assistant:

inline  TPZFNMatrix(int64_t row, int64_t col, const TVar &val) : TPZRegisterClassId(&TPZFNMatrix<N,TVar>::ClassId), 
    TPZFMatrix<TVar>(row,col,fBuf,N) {
        TPZFMatrix<TVar>::operator=(val);
    }